

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SoftmaxNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_softmaxnd(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  SoftmaxNDLayerParams *pSVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_softmaxnd(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_softmaxnd(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pSVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::SoftmaxNDLayerParams>(arena);
    (this->layer_).softmaxnd_ = pSVar2;
  }
  return (SoftmaxNDLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SoftmaxNDLayerParams* NeuralNetworkLayer::_internal_mutable_softmaxnd() {
  if (!_internal_has_softmaxnd()) {
    clear_layer();
    set_has_softmaxnd();
    layer_.softmaxnd_ = CreateMaybeMessage< ::CoreML::Specification::SoftmaxNDLayerParams >(GetArenaForAllocation());
  }
  return layer_.softmaxnd_;
}